

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTextUndoCommand>::appendInitialize
          (QArrayDataPointer<QTextUndoCommand> *this,qsizetype newSize)

{
  QTextUndoCommand *pQVar1;
  QAbstractUndoItem *in_RSI;
  QTextUndoCommand *in_RDI;
  QTextUndoCommand *e;
  QTextUndoCommand *b;
  
  begin((QArrayDataPointer<QTextUndoCommand> *)0x7e27a0);
  pQVar1 = begin((QArrayDataPointer<QTextUndoCommand> *)0x7e27b9);
  std::uninitialized_value_construct<QTextUndoCommand*>(pQVar1 + (long)in_RSI,in_RDI);
  (in_RDI->field_8).custom = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }